

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O1

void __thiscall Logger::~Logger(Logger *this)

{
  Buffer *logline;
  char **ppcVar1;
  char *pcVar2;
  size_t __n;
  pointer pcVar3;
  LogStream *pLVar4;
  char **ppcVar5;
  int iVar6;
  
  ppcVar5 = &(this->impl_).stream_.buffer_.cur_;
  pcVar2 = (this->impl_).stream_.buffer_.cur_;
  iVar6 = (int)ppcVar5;
  if (4 < iVar6 - (int)pcVar2) {
    builtin_strncpy(pcVar2," -- ",4);
    *ppcVar5 = *ppcVar5 + 4;
  }
  pcVar2 = (this->impl_).stream_.buffer_.cur_;
  __n = (this->impl_).basename_._M_string_length;
  if ((int)__n < iVar6 - (int)pcVar2) {
    memcpy(pcVar2,(this->impl_).basename_._M_dataplus._M_p,__n);
    ppcVar1 = &(this->impl_).stream_.buffer_.cur_;
    *ppcVar1 = *ppcVar1 + __n;
  }
  if (1 < iVar6 - (int)*ppcVar5) {
    **ppcVar5 = ':';
    *ppcVar5 = *ppcVar5 + 1;
  }
  pLVar4 = LogStream::operator<<((LogStream *)this,(this->impl_).line_);
  ppcVar5 = &(pLVar4->buffer_).cur_;
  pcVar2 = (pLVar4->buffer_).cur_;
  if (1 < (int)ppcVar5 - (int)pcVar2) {
    *pcVar2 = '\n';
    *ppcVar5 = *ppcVar5 + 1;
  }
  pcVar2 = (this->impl_).stream_.buffer_.cur_;
  pthread_once(&once_control,once_init);
  logline = &(this->impl_).stream_.buffer_;
  AsyncLogging::append
            (AsyncLogger_.super___shared_ptr<AsyncLogging,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             logline->data_,(int)pcVar2 - (int)logline);
  pcVar3 = (this->impl_).basename_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->impl_).basename_.field_2) {
    operator_delete(pcVar3);
    return;
  }
  return;
}

Assistant:

Logger::~Logger() {
    impl_.stream_ << " -- " << impl_.basename_ << ":" << impl_.line_ << "\n";
    const LogStream::Buffer& buf(stream().buffer());
    output(buf.data(), buf.length());
}